

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printAutomation(adjacencyType *adjVec)

{
  _Rb_tree_node_base *p_Var1;
  pointer pmVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int i;
  ulong uVar6;
  
  uVar6 = 0;
  while( true ) {
    pmVar2 = (adjVec->
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(adjVec->
                       super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar2) / 0x30) <= uVar6)
    break;
    p_Var1 = &pmVar2[uVar6]._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var5 = p_Var1->_M_left; p_Var5 != p_Var1;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      for (p_Var4 = p_Var5[2]._M_right; p_Var4 != (_Base_ptr)&p_Var5[2]._M_parent;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar6);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = std::operator<<(poVar3,(string *)(p_Var5 + 1));
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,p_Var4[1]._M_color);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void printAutomation(const adjacencyType & adjVec) {
    for (auto i = 0; i < adjVec.size(); ++ i) {
        for (auto & iter : adjVec[i]) {
            for (auto & iterVec : iter.second) {
                cout << i << " " << iter.first << " " << iterVec << endl;
            }
        }
    }
}